

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeZeroObjVariablePS::execute
          (FreeZeroObjVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  uint *puVar2;
  int iVar3;
  VarStatus VVar4;
  pointer pnVar5;
  pointer pDVar6;
  type_conflict5 tVar7;
  bool bVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  uint uVar12;
  int k;
  long lVar13;
  cpp_dec_float<50U,_int,_void> *this_00;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar14;
  long lVar15;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  int k_1;
  long lVar17;
  ulong uVar18;
  int l;
  ulong uVar19;
  uint local_414;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  up;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  slack;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  soplex local_d8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  soplex local_68 [56];
  
  b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)(long)this->m_j;
  if (this->m_j != this->m_old_j) {
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar5[this->m_old_j].m_backend,&pnVar5[(long)b].m_backend);
    pnVar5 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar5[this->m_old_j].m_backend,&pnVar5[this->m_j].m_backend);
    b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)cStatus->data;
    (b->m_backend).data._M_elems[this->m_old_j] = (b->m_backend).data._M_elems[this->m_j];
  }
  iVar3 = (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  lVar9 = (long)(this->m_old_i - iVar3);
  lVar17 = 0xe;
  lVar13 = lVar9 * 0x38;
  for (lVar15 = 0; lVar15 < iVar3; lVar15 = lVar15 + 1) {
    uVar12 = (((this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem)->val).m_backend.data._M_elems[lVar17];
    pnVar5 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)((long)pnVar5[1].m_backend.data._M_elems + lVar13),
               &pnVar5[(int)uVar12].m_backend);
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)((long)pnVar5[1].m_backend.data._M_elems + lVar13),
               &pnVar5[(int)uVar12].m_backend);
    VVar4 = rStatus->data[(int)uVar12];
    b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)(ulong)VVar4;
    rStatus->data[lVar9 + lVar15 + 1] = VVar4;
    iVar3 = (this->m_col).
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused;
    lVar17 = lVar17 + 0xf;
    lVar13 = lVar13 + 0x38;
  }
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase(&slack,iVar3);
  if (this->m_loFree == false) {
    pdVar10 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result_11.m_backend,-*pdVar10,(type *)0x0);
    local_414 = 0xffffffff;
    pSVar1 = &(this->m_lRhs).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    for (lVar17 = 0;
        lVar17 < (int)((ulong)((long)(this->m_rows).data.
                                     super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_rows).data.
                                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar17 = lVar17 + 1) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&val.m_backend,0.0,(type *)0x0);
      pDVar6 = (this->m_rows).data.
               super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar16 = &pDVar6[lVar17].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      lVar13 = 0;
      for (lVar9 = 0;
          lVar9 < pDVar6[lVar17].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused; lVar9 = lVar9 + 1) {
        pNVar14 = pSVar16->m_elem;
        iVar3 = *(int *)((long)(&pNVar14->val + 1) + lVar13);
        if (iVar3 != this->m_j) {
          scale.m_backend.fpclass = cpp_dec_float_finite;
          scale.m_backend.prec_elem = 10;
          scale.m_backend.data._M_elems[0] = 0;
          scale.m_backend.data._M_elems[1] = 0;
          scale.m_backend.data._M_elems[2] = 0;
          scale.m_backend.data._M_elems[3] = 0;
          scale.m_backend.data._M_elems[4] = 0;
          scale.m_backend.data._M_elems[5] = 0;
          scale.m_backend.data._M_elems._24_5_ = 0;
          scale.m_backend.data._M_elems[7]._1_3_ = 0;
          scale.m_backend.data._M_elems._32_5_ = 0;
          scale.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&scale.m_backend,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)(pNVar14->val).m_backend.data._M_elems + lVar13),
                     &(x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&val.m_backend,&scale.m_backend);
        }
        lVar13 = lVar13 + 0x3c;
      }
      uVar12 = (uint)lVar17;
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_d8,pSVar1,uVar12);
      local_1c8.m_backend.data._M_elems[8] = val.m_backend.data._M_elems[8];
      local_1c8.m_backend.data._M_elems[9] = val.m_backend.data._M_elems[9];
      local_1c8.m_backend.data._M_elems[4] = val.m_backend.data._M_elems[4];
      local_1c8.m_backend.data._M_elems[5] = val.m_backend.data._M_elems[5];
      local_1c8.m_backend.data._M_elems[6] = val.m_backend.data._M_elems[6];
      local_1c8.m_backend.data._M_elems[7] = val.m_backend.data._M_elems[7];
      local_1c8.m_backend.data._M_elems[0] = val.m_backend.data._M_elems[0];
      local_1c8.m_backend.data._M_elems[1] = val.m_backend.data._M_elems[1];
      local_1c8.m_backend.data._M_elems[2] = val.m_backend.data._M_elems[2];
      local_1c8.m_backend.data._M_elems[3] = val.m_backend.data._M_elems[3];
      local_1c8.m_backend.exp = val.m_backend.exp;
      local_1c8.m_backend.neg = val.m_backend.neg;
      local_1c8.m_backend.fpclass = val.m_backend.fpclass;
      local_1c8.m_backend.prec_elem = val.m_backend.prec_elem;
      maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&scale.m_backend,local_d8,&local_1c8,b);
      z.m_backend.data._M_elems[0] = 0;
      z.m_backend.data._M_elems[1] = 0x3ff00000;
      tVar7 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&scale.m_backend,(double *)&z);
      if (tVar7) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&scale.m_backend,1.0);
      }
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_3.m_backend,pSVar1,uVar12);
      up.m_backend.fpclass = cpp_dec_float_finite;
      up.m_backend.prec_elem = 10;
      up.m_backend.data._M_elems[0] = 0;
      up.m_backend.data._M_elems[1] = 0;
      up.m_backend.data._M_elems[2] = 0;
      up.m_backend.data._M_elems[3] = 0;
      up.m_backend.data._M_elems[4] = 0;
      up.m_backend.data._M_elems[5] = 0;
      up.m_backend.data._M_elems._24_5_ = 0;
      up.m_backend.data._M_elems[7]._1_3_ = 0;
      up.m_backend.data._M_elems._32_5_ = 0;
      up.m_backend.data._M_elems[9]._1_3_ = 0;
      up.m_backend.exp = 0;
      up.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&up.m_backend,&result_3.m_backend,&scale.m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_1.m_backend,&val.m_backend,&scale.m_backend);
      z.m_backend.fpclass = cpp_dec_float_finite;
      z.m_backend.prec_elem = 10;
      z.m_backend.data._M_elems[0] = 0;
      z.m_backend.data._M_elems[1] = 0;
      z.m_backend.data._M_elems[2] = 0;
      z.m_backend.data._M_elems[3] = 0;
      z.m_backend.data._M_elems[4] = 0;
      z.m_backend.data._M_elems[5] = 0;
      z.m_backend.data._M_elems[6] = 0;
      z.m_backend.data._M_elems[7] = 0;
      z.m_backend.data._M_elems._32_5_ = 0;
      z.m_backend.data._M_elems[9]._1_3_ = 0;
      z.m_backend.exp = 0;
      z.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&z.m_backend,&up.m_backend,&result_1.m_backend);
      local_208.m_backend.data._M_elems[0] = z.m_backend.data._M_elems[0];
      local_208.m_backend.data._M_elems[1] = z.m_backend.data._M_elems[1];
      local_208.m_backend.data._M_elems[2] = z.m_backend.data._M_elems[2];
      local_208.m_backend.data._M_elems[3] = z.m_backend.data._M_elems[3];
      local_208.m_backend.data._M_elems[4] = z.m_backend.data._M_elems[4];
      local_208.m_backend.data._M_elems[5] = z.m_backend.data._M_elems[5];
      local_208.m_backend.data._M_elems[6] = z.m_backend.data._M_elems[6];
      local_208.m_backend.data._M_elems[7] = z.m_backend.data._M_elems[7];
      local_208.m_backend.data._M_elems[9]._1_3_ = z.m_backend.data._M_elems[9]._1_3_;
      local_208.m_backend.data._M_elems._32_5_ = z.m_backend.data._M_elems._32_5_;
      local_208.m_backend.exp = z.m_backend.exp;
      local_208.m_backend.neg = z.m_backend.neg;
      local_208.m_backend.fpclass = z.m_backend.fpclass;
      local_208.m_backend.prec_elem = z.m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_110,this);
      bVar8 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_208,&local_110);
      if (bVar8) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&z,0.0);
      }
      result_3.m_backend.fpclass = cpp_dec_float_finite;
      result_3.m_backend.prec_elem = 10;
      result_3.m_backend.data._M_elems[0] = 0;
      result_3.m_backend.data._M_elems[1] = 0;
      result_3.m_backend.data._M_elems[2] = 0;
      result_3.m_backend.data._M_elems[3] = 0;
      result_3.m_backend.data._M_elems[4] = 0;
      result_3.m_backend.data._M_elems[5] = 0;
      result_3.m_backend.data._M_elems._24_5_ = 0;
      result_3.m_backend.data._M_elems[7]._1_3_ = 0;
      result_3.m_backend.data._M_elems._32_5_ = 0;
      result_3.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_3.m_backend,&z.m_backend,&scale.m_backend);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_1.m_backend,pSVar16,this->m_j);
      up.m_backend.fpclass = cpp_dec_float_finite;
      up.m_backend.prec_elem = 10;
      up.m_backend.data._M_elems[0] = 0;
      up.m_backend.data._M_elems[1] = 0;
      up.m_backend.data._M_elems[2] = 0;
      up.m_backend.data._M_elems[3] = 0;
      up.m_backend.data._M_elems[4] = 0;
      up.m_backend.data._M_elems[5] = 0;
      up.m_backend.data._M_elems._24_5_ = 0;
      up.m_backend.data._M_elems[7]._1_3_ = 0;
      up.m_backend.data._M_elems._32_5_ = 0;
      up.m_backend.data._M_elems[9]._1_3_ = 0;
      up.m_backend.exp = 0;
      up.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&up.m_backend,&result_3.m_backend,&result_1.m_backend);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(&slack,uVar12,&val);
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&up.m_backend,&result_11);
      if (tVar7) {
        result_11.m_backend.data._M_elems._32_5_ = up.m_backend.data._M_elems._32_5_;
        result_11.m_backend.data._M_elems[9]._1_3_ = up.m_backend.data._M_elems[9]._1_3_;
        result_11.m_backend.data._M_elems[4] = up.m_backend.data._M_elems[4];
        result_11.m_backend.data._M_elems[5] = up.m_backend.data._M_elems[5];
        result_11.m_backend.data._M_elems._24_5_ = up.m_backend.data._M_elems._24_5_;
        result_11.m_backend.data._M_elems[7]._1_3_ = up.m_backend.data._M_elems[7]._1_3_;
        result_11.m_backend.data._M_elems[0] = up.m_backend.data._M_elems[0];
        result_11.m_backend.data._M_elems[1] = up.m_backend.data._M_elems[1];
        result_11.m_backend.data._M_elems[2] = up.m_backend.data._M_elems[2];
        result_11.m_backend.data._M_elems[3] = up.m_backend.data._M_elems[3];
        result_11.m_backend.exp = up.m_backend.exp;
        result_11.m_backend.neg = up.m_backend.neg;
        result_11.m_backend.fpclass = up.m_backend.fpclass;
        result_11.m_backend.prec_elem = up.m_backend.prec_elem;
        local_414 = uVar12;
      }
    }
    tVar7 = boost::multiprecision::operator>(&this->m_bnd,&result_11);
  }
  else {
    pdVar10 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result_11.m_backend,*pdVar10,(type *)0x0);
    pSVar1 = &(this->m_lRhs).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    local_414 = 0xffffffff;
    for (lVar17 = 0;
        lVar17 < (int)((ulong)((long)(this->m_rows).data.
                                     super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_rows).data.
                                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar17 = lVar17 + 1) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&val.m_backend,0.0,(type *)0x0);
      pDVar6 = (this->m_rows).data.
               super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar16 = &pDVar6[lVar17].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      lVar13 = 0;
      for (lVar9 = 0;
          lVar9 < pDVar6[lVar17].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused; lVar9 = lVar9 + 1) {
        pNVar14 = pSVar16->m_elem;
        iVar3 = *(int *)((long)(&pNVar14->val + 1) + lVar13);
        if (iVar3 != this->m_j) {
          scale.m_backend.fpclass = cpp_dec_float_finite;
          scale.m_backend.prec_elem = 10;
          scale.m_backend.data._M_elems[0] = 0;
          scale.m_backend.data._M_elems[1] = 0;
          scale.m_backend.data._M_elems[2] = 0;
          scale.m_backend.data._M_elems[3] = 0;
          scale.m_backend.data._M_elems[4] = 0;
          scale.m_backend.data._M_elems[5] = 0;
          scale.m_backend.data._M_elems._24_5_ = 0;
          scale.m_backend.data._M_elems[7]._1_3_ = 0;
          scale.m_backend.data._M_elems._32_5_ = 0;
          scale.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&scale.m_backend,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)(pNVar14->val).m_backend.data._M_elems + lVar13),
                     &(x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&val.m_backend,&scale.m_backend);
        }
        lVar13 = lVar13 + 0x3c;
      }
      uVar12 = (uint)lVar17;
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_68,pSVar1,uVar12);
      local_148.m_backend.data._M_elems[8] = val.m_backend.data._M_elems[8];
      local_148.m_backend.data._M_elems[9] = val.m_backend.data._M_elems[9];
      local_148.m_backend.data._M_elems[4] = val.m_backend.data._M_elems[4];
      local_148.m_backend.data._M_elems[5] = val.m_backend.data._M_elems[5];
      local_148.m_backend.data._M_elems[6] = val.m_backend.data._M_elems[6];
      local_148.m_backend.data._M_elems[7] = val.m_backend.data._M_elems[7];
      local_148.m_backend.data._M_elems[0] = val.m_backend.data._M_elems[0];
      local_148.m_backend.data._M_elems[1] = val.m_backend.data._M_elems[1];
      local_148.m_backend.data._M_elems[2] = val.m_backend.data._M_elems[2];
      local_148.m_backend.data._M_elems[3] = val.m_backend.data._M_elems[3];
      local_148.m_backend.exp = val.m_backend.exp;
      local_148.m_backend.neg = val.m_backend.neg;
      local_148.m_backend.fpclass = val.m_backend.fpclass;
      local_148.m_backend.prec_elem = val.m_backend.prec_elem;
      maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&scale.m_backend,local_68,&local_148,b);
      z.m_backend.data._M_elems[0] = 0;
      z.m_backend.data._M_elems[1] = 0x3ff00000;
      tVar7 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&scale.m_backend,(double *)&z);
      if (tVar7) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&scale.m_backend,1.0);
      }
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_3.m_backend,pSVar1,uVar12);
      up.m_backend.fpclass = cpp_dec_float_finite;
      up.m_backend.prec_elem = 10;
      up.m_backend.data._M_elems[0] = 0;
      up.m_backend.data._M_elems[1] = 0;
      up.m_backend.data._M_elems[2] = 0;
      up.m_backend.data._M_elems[3] = 0;
      up.m_backend.data._M_elems[4] = 0;
      up.m_backend.data._M_elems[5] = 0;
      up.m_backend.data._M_elems._24_5_ = 0;
      up.m_backend.data._M_elems[7]._1_3_ = 0;
      up.m_backend.data._M_elems._32_5_ = 0;
      up.m_backend.data._M_elems[9]._1_3_ = 0;
      up.m_backend.exp = 0;
      up.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&up.m_backend,&result_3.m_backend,&scale.m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_1.m_backend,&val.m_backend,&scale.m_backend);
      z.m_backend.fpclass = cpp_dec_float_finite;
      z.m_backend.prec_elem = 10;
      z.m_backend.data._M_elems[0] = 0;
      z.m_backend.data._M_elems[1] = 0;
      z.m_backend.data._M_elems[2] = 0;
      z.m_backend.data._M_elems[3] = 0;
      z.m_backend.data._M_elems[4] = 0;
      z.m_backend.data._M_elems[5] = 0;
      z.m_backend.data._M_elems[6] = 0;
      z.m_backend.data._M_elems[7] = 0;
      z.m_backend.data._M_elems._32_5_ = 0;
      z.m_backend.data._M_elems[9]._1_3_ = 0;
      z.m_backend.exp = 0;
      z.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&z.m_backend,&up.m_backend,&result_1.m_backend);
      local_188.m_backend.data._M_elems[0] = z.m_backend.data._M_elems[0];
      local_188.m_backend.data._M_elems[1] = z.m_backend.data._M_elems[1];
      local_188.m_backend.data._M_elems[2] = z.m_backend.data._M_elems[2];
      local_188.m_backend.data._M_elems[3] = z.m_backend.data._M_elems[3];
      local_188.m_backend.data._M_elems[4] = z.m_backend.data._M_elems[4];
      local_188.m_backend.data._M_elems[5] = z.m_backend.data._M_elems[5];
      local_188.m_backend.data._M_elems[6] = z.m_backend.data._M_elems[6];
      local_188.m_backend.data._M_elems[7] = z.m_backend.data._M_elems[7];
      local_188.m_backend.data._M_elems[9]._1_3_ = z.m_backend.data._M_elems[9]._1_3_;
      local_188.m_backend.data._M_elems._32_5_ = z.m_backend.data._M_elems._32_5_;
      local_188.m_backend.exp = z.m_backend.exp;
      local_188.m_backend.neg = z.m_backend.neg;
      local_188.m_backend.fpclass = z.m_backend.fpclass;
      local_188.m_backend.prec_elem = z.m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
      bVar8 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_188,&local_a0);
      if (bVar8) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&z,0.0);
      }
      result_3.m_backend.fpclass = cpp_dec_float_finite;
      result_3.m_backend.prec_elem = 10;
      result_3.m_backend.data._M_elems[0] = 0;
      result_3.m_backend.data._M_elems[1] = 0;
      result_3.m_backend.data._M_elems[2] = 0;
      result_3.m_backend.data._M_elems[3] = 0;
      result_3.m_backend.data._M_elems[4] = 0;
      result_3.m_backend.data._M_elems[5] = 0;
      result_3.m_backend.data._M_elems._24_5_ = 0;
      result_3.m_backend.data._M_elems[7]._1_3_ = 0;
      result_3.m_backend.data._M_elems._32_5_ = 0;
      result_3.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_3.m_backend,&z.m_backend,&scale.m_backend);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_1.m_backend,pSVar16,this->m_j);
      up.m_backend.fpclass = cpp_dec_float_finite;
      up.m_backend.prec_elem = 10;
      up.m_backend.data._M_elems[0] = 0;
      up.m_backend.data._M_elems[1] = 0;
      up.m_backend.data._M_elems[2] = 0;
      up.m_backend.data._M_elems[3] = 0;
      up.m_backend.data._M_elems[4] = 0;
      up.m_backend.data._M_elems[5] = 0;
      up.m_backend.data._M_elems._24_5_ = 0;
      up.m_backend.data._M_elems[7]._1_3_ = 0;
      up.m_backend.data._M_elems._32_5_ = 0;
      up.m_backend.data._M_elems[9]._1_3_ = 0;
      up.m_backend.exp = 0;
      up.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&up.m_backend,&result_3.m_backend,&result_1.m_backend);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(&slack,uVar12,&val);
      tVar7 = boost::multiprecision::operator<(&up,&result_11);
      if (tVar7) {
        result_11.m_backend.data._M_elems._32_5_ = up.m_backend.data._M_elems._32_5_;
        result_11.m_backend.data._M_elems[9]._1_3_ = up.m_backend.data._M_elems[9]._1_3_;
        result_11.m_backend.data._M_elems[4] = up.m_backend.data._M_elems[4];
        result_11.m_backend.data._M_elems[5] = up.m_backend.data._M_elems[5];
        result_11.m_backend.data._M_elems._24_5_ = up.m_backend.data._M_elems._24_5_;
        result_11.m_backend.data._M_elems[7]._1_3_ = up.m_backend.data._M_elems[7]._1_3_;
        result_11.m_backend.data._M_elems[0] = up.m_backend.data._M_elems[0];
        result_11.m_backend.data._M_elems[1] = up.m_backend.data._M_elems[1];
        result_11.m_backend.data._M_elems[2] = up.m_backend.data._M_elems[2];
        result_11.m_backend.data._M_elems[3] = up.m_backend.data._M_elems[3];
        result_11.m_backend.exp = up.m_backend.exp;
        result_11.m_backend.neg = up.m_backend.neg;
        result_11.m_backend.fpclass = up.m_backend.fpclass;
        result_11.m_backend.prec_elem = up.m_backend.prec_elem;
        local_414 = uVar12;
      }
    }
    tVar7 = boost::multiprecision::operator<(&this->m_bnd,&result_11);
  }
  this_00 = &(x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
  if (tVar7 == false) {
    *(ulong *)((this_00->data)._M_elems + 8) =
         CONCAT35(result_11.m_backend.data._M_elems[9]._1_3_,
                  result_11.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((this_00->data)._M_elems + 4) = result_11.m_backend.data._M_elems._16_8_;
    *(ulong *)((this_00->data)._M_elems + 6) =
         CONCAT35(result_11.m_backend.data._M_elems[7]._1_3_,
                  result_11.m_backend.data._M_elems._24_5_);
    *(undefined8 *)(this_00->data)._M_elems = result_11.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((this_00->data)._M_elems + 2) = result_11.m_backend.data._M_elems._8_8_;
    this_00->exp = result_11.m_backend.exp;
    this_00->neg = result_11.m_backend.neg;
    this_00->fpclass = result_11.m_backend.fpclass;
    this_00->prec_elem = result_11.m_backend.prec_elem;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (this_00,&(this->m_bnd).m_backend);
    local_414 = 0xffffffff;
  }
  lVar13 = 0;
  for (lVar17 = 0;
      lVar17 < (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused; lVar17 = lVar17 + 1) {
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&val.m_backend,
                 &slack.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,(int)lVar17);
    scale.m_backend.fpclass = cpp_dec_float_finite;
    scale.m_backend.prec_elem = 10;
    scale.m_backend.data._M_elems[0] = 0;
    scale.m_backend.data._M_elems[1] = 0;
    scale.m_backend.data._M_elems[2] = 0;
    scale.m_backend.data._M_elems[3] = 0;
    scale.m_backend.data._M_elems[4] = 0;
    scale.m_backend.data._M_elems[5] = 0;
    scale.m_backend.data._M_elems._24_5_ = 0;
    scale.m_backend.data._M_elems[7]._1_3_ = 0;
    scale.m_backend.data._M_elems._32_5_ = 0;
    scale.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&scale.m_backend,
               (cpp_dec_float<50U,_int,_void> *)
               ((long)(((this->m_col).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem)->val).m_backend.data._M_elems + lVar13),
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
    result_11.m_backend.fpclass = cpp_dec_float_finite;
    result_11.m_backend.prec_elem = 10;
    result_11.m_backend.data._M_elems[0] = 0;
    result_11.m_backend.data._M_elems[1] = 0;
    result_11.m_backend.data._M_elems[2] = 0;
    result_11.m_backend.data._M_elems[3] = 0;
    result_11.m_backend.data._M_elems[4] = 0;
    result_11.m_backend.data._M_elems[5] = 0;
    result_11.m_backend.data._M_elems._24_5_ = 0;
    result_11.m_backend.data._M_elems[7]._1_3_ = 0;
    result_11.m_backend.data._M_elems._32_5_ = 0;
    result_11.m_backend.data._M_elems[9]._1_3_ = 0;
    result_11.m_backend.exp = 0;
    result_11.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_11.m_backend,&val.m_backend,&scale.m_backend);
    iVar3 = *(int *)((long)(&((this->m_col).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem)->val + 1) + lVar13);
    pnVar5 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         CONCAT35(result_11.m_backend.data._M_elems[9]._1_3_,
                  result_11.m_backend.data._M_elems._32_5_);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = result_11.m_backend.data._M_elems._16_8_;
    *(ulong *)(puVar2 + 2) =
         CONCAT35(result_11.m_backend.data._M_elems[7]._1_3_,
                  result_11.m_backend.data._M_elems._24_5_);
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = result_11.m_backend.data._M_elems._0_8_;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) =
         result_11.m_backend.data._M_elems._8_8_;
    pnVar5[iVar3].m_backend.exp = result_11.m_backend.exp;
    pnVar5[iVar3].m_backend.neg = result_11.m_backend.neg;
    pnVar5[iVar3].m_backend.fpclass = result_11.m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = result_11.m_backend.prec_elem;
    lVar13 = lVar13 + 0x3c;
  }
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  lVar17 = 0x38;
  for (lVar13 = 0;
      uVar11 = (ulong)(this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, lVar13 < (long)uVar11; lVar13 = lVar13 + 1) {
    iVar3 = *(int *)((long)(((this->m_col).
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar17);
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&result_11,
                 &(this->m_rowObj).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,iVar3);
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         CONCAT35(result_11.m_backend.data._M_elems[9]._1_3_,
                  result_11.m_backend.data._M_elems._32_5_);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = result_11.m_backend.data._M_elems._16_8_;
    *(ulong *)(puVar2 + 2) =
         CONCAT35(result_11.m_backend.data._M_elems[7]._1_3_,
                  result_11.m_backend.data._M_elems._24_5_);
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = result_11.m_backend.data._M_elems._0_8_;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) =
         result_11.m_backend.data._M_elems._8_8_;
    pnVar5[iVar3].m_backend.exp = result_11.m_backend.exp;
    pnVar5[iVar3].m_backend.neg = result_11.m_backend.neg;
    pnVar5[iVar3].m_backend.fpclass = result_11.m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = result_11.m_backend.prec_elem;
    lVar17 = lVar17 + 0x3c;
  }
  uVar19 = (ulong)local_414;
  lVar17 = 0x38;
  for (uVar18 = 0; (long)uVar18 < (long)(int)uVar11; uVar18 = uVar18 + 1) {
    if (uVar19 == uVar18) {
      cStatus->data[this->m_j] = BASIC;
      pNVar14 = (this->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem + uVar19;
      if (this->m_loFree == true) {
        result_11.m_backend.data._M_elems._0_8_ =
             (ulong)result_11.m_backend.data._M_elems[1] << 0x20;
        tVar7 = boost::multiprecision::operator>(&pNVar14->val,(int *)&result_11);
        bVar8 = !tVar7;
      }
      else {
        result_11.m_backend.data._M_elems._0_8_ =
             (ulong)result_11.m_backend.data._M_elems[1] << 0x20;
        bVar8 = boost::multiprecision::operator>(&pNVar14->val,(int *)&result_11);
      }
      rStatus->data
      [(this->m_col).
       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .m_elem[uVar19].idx] = (uint)bVar8;
    }
    else {
      rStatus->data
      [*(int *)((long)(((this->m_col).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem)->val).m_backend.data._M_elems + lVar17)] = BASIC;
    }
    uVar11 = (ulong)(uint)(this->m_col).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
    lVar17 = lVar17 + 0x3c;
  }
  if (local_414 == 0xffffffff) {
    cStatus->data[this->m_j] = this->m_loFree ^ ON_LOWER;
  }
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~DSVectorBase(&slack);
  return;
}

Assistant:

void SPxMainSM<R>::FreeZeroObjVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   int rIdx = m_old_i - m_col.size() + 1;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int rIdx_new = m_col.index(k);
      s[rIdx] = s[rIdx_new];
      y[rIdx] = y[rIdx_new];
      rStatus[rIdx] = rStatus[rIdx_new];
      rIdx++;
   }

   // primal:
   int      domIdx = -1;
   DSVectorBase<R> slack(m_col.size());

   if(m_loFree)
   {
      R minRowUp = R(infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R           val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R up = z * scale / row[m_j];
         slack.add(k, val);

         if(up < minRowUp)
         {
            minRowUp = up;
            domIdx   = k;
         }
      }

      if(m_bnd < minRowUp)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = minRowUp;
   }
   else
   {
      R maxRowLo = R(-infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R lo = z * scale / row[m_j];
         slack.add(k, val);

         if(lo > maxRowLo)
         {
            maxRowLo = lo;
            domIdx   = k;
         }
      }

      if(m_bnd > maxRowLo)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = maxRowLo;
   }

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] = slack[k] + m_col.value(k) * x[m_j];

   // dual:
   r[m_j] = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int idx = m_col.index(k);
      y[idx] = m_rowObj[idx];
   }

   // basis:
   for(int k = 0; k < m_col.size(); ++k)
   {
      if(k != domIdx)
         rStatus[m_col.index(k)] = SPxSolverBase<R>::BASIC;

      else
      {
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

         if(m_loFree)
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_UPPER :
                                      SPxSolverBase<R>::ON_LOWER;
         else
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_LOWER :
                                      SPxSolverBase<R>::ON_UPPER;
      }
   }

   if(domIdx == -1)
   {
      if(m_loFree)
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM20 Dimension doesn't match after this step.");
   }

#endif
}